

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_unres_depset(ly_ctx *ctx,lys_glob_unres *unres)

{
  void **ppvVar1;
  lyxp_set_scnode *plVar2;
  lysc_type_bitenum_item *item;
  ushort uVar3;
  uint32_t uVar4;
  lyd_node *plVar5;
  lyplg_type *plVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  long lVar9;
  lyd_node_inner *plVar10;
  bool bVar11;
  undefined1 *puVar12;
  ly_ctx *ctx_00;
  ly_bool lVar13;
  LY_ERR LVar14;
  int iVar15;
  lysc_type_leafref *plVar16;
  lysc_must *plVar17;
  lysc_ext_instance *plVar18;
  lysc_type *plVar19;
  lys_module *plVar20;
  lysc_when **pplVar21;
  lysc_when *plVar22;
  lysc_must *plVar23;
  ulong uVar24;
  lysc_node *plVar25;
  ly_ht *plVar26;
  long *plVar27;
  void *pvVar28;
  lyd_value *storage;
  ushort uVar29;
  ushort uVar30;
  long lVar31;
  lysc_node *plVar32;
  uint uVar33;
  lysc_ext_instance *plVar34;
  ulong uVar35;
  lysc_type **pplVar36;
  undefined4 *puVar37;
  uint64_t u;
  ulong uVar38;
  char *pcVar39;
  ulong uVar40;
  lysc_node *plVar41;
  lysc_when *plVar42;
  lysp_module **pplVar43;
  void *pvVar44;
  bool bVar45;
  uint64_t v;
  lys_depset_unres *ds_unres;
  ly_path *path;
  lysc_ctx cctx;
  uint local_1270;
  uint64_t local_1248;
  ulong local_1240;
  uint local_1234;
  ly_set *local_1230;
  ly_set *local_1228;
  lysf_ctx *local_1220;
  lysc_node *local_1218;
  ly_set *local_1210;
  ly_set *local_1208;
  ly_set *local_1200;
  lyxp_set local_11f8;
  lyxp_set local_1168;
  lysc_ctx local_10d0;
  
  memset(&local_10d0,0,0x10a0);
  local_1228 = &(unres->ds_unres).whens;
  local_1230 = &(unres->ds_unres).musts;
  local_1200 = &(unres->ds_unres).disabled_leafrefs;
  local_1220 = &local_10d0.free_ctx;
  local_1208 = &(unres->ds_unres).disabled_bitenums;
  local_1210 = &(unres->ds_unres).dflts;
  local_1240 = 0;
  do {
    uVar38 = 0;
    uVar35 = 0;
    uVar40 = 0;
    uVar24 = 0;
    do {
      if ((uint)uVar38 < (unres->ds_unres).disabled_leafrefs.count) {
        uVar38 = uVar38 & 0xffffffff;
        do {
          plVar5 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar38];
          local_11f8._0_8_ = (lysc_ext_instance *)0x0;
          while (plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,(uint64_t *)&local_11f8),
                plVar16 != (lysc_type_leafref *)0x0) {
            LVar14 = lys_compile_expr_implement
                               (ctx,plVar16->path,LY_VALUE_SCHEMA_RESOLVED,plVar16->prefixes,'\x01',
                                unres,(lys_module **)0x0);
            plVar34 = (lysc_ext_instance *)local_11f8._0_8_;
            if (LVar14 != LY_SUCCESS) goto LAB_00143576;
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < (unres->ds_unres).disabled_leafrefs.count);
      }
      if ((uint)uVar35 < (unres->ds_unres).leafrefs.count) {
        uVar35 = uVar35 & 0xffffffff;
        do {
          plVar5 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar35];
          local_11f8._0_8_ = (lysc_ext_instance *)0x0;
          while (plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,(uint64_t *)&local_11f8),
                plVar16 != (lysc_type_leafref *)0x0) {
            LVar14 = lys_compile_expr_implement
                               (ctx,plVar16->path,LY_VALUE_SCHEMA_RESOLVED,plVar16->prefixes,'\x01',
                                unres,(lys_module **)0x0);
            plVar34 = (lysc_ext_instance *)local_11f8._0_8_;
            if (LVar14 != LY_SUCCESS) goto LAB_00143576;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < (unres->ds_unres).leafrefs.count);
      }
      if ((uint)uVar40 < (unres->ds_unres).whens.count) {
        uVar40 = uVar40 & 0xffffffff;
        do {
          plVar5 = (unres->ds_unres).whens.field_2.dnodes[uVar40];
          plVar41 = plVar5->schema;
          LVar14 = lys_compile_expr_implement
                             (ctx,*(lyxp_expr **)plVar41,LY_VALUE_SCHEMA_RESOLVED,plVar41->parent,
                              (byte)ctx->flags & 2,unres,(lys_module **)&local_1168);
          plVar34 = (lysc_ext_instance *)local_11f8._0_8_;
          if (LVar14 != LY_SUCCESS) goto LAB_00143576;
          if ((lys_module *)local_1168._0_8_ == (lys_module *)0x0) {
            uVar40 = uVar40 + 1;
          }
          else {
            ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                   "When condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                   ,*(undefined8 *)(*(long *)plVar5->schema + 0x28),
                   *(lysc_ext_instance **)(local_1168._0_8_ + 8));
            ly_set_rm_index(local_1228,(uint32_t)uVar40,free);
          }
        } while (uVar40 < (unres->ds_unres).whens.count);
      }
      plVar34 = (lysc_ext_instance *)local_11f8._0_8_;
      if ((uint)uVar24 < (unres->ds_unres).musts.count) {
        uVar24 = uVar24 & 0xffffffff;
        do {
          while( true ) {
            plVar5 = (unres->ds_unres).musts.field_2.dnodes[uVar24];
            plVar17 = lysc_node_musts(*(lysc_node **)plVar5);
            plVar34 = (lysc_ext_instance *)0x0;
            bVar45 = false;
            plVar23 = plVar17;
            while( true ) {
              if (plVar17 == (lysc_must *)0x0) {
                plVar18 = (lysc_ext_instance *)0x0;
              }
              else {
                plVar18 = plVar17[-1].exts;
              }
              if (plVar18 <= plVar34) break;
              LVar14 = lys_compile_expr_implement
                                 (ctx,plVar23->cond,LY_VALUE_SCHEMA_RESOLVED,plVar23->prefixes,
                                  (byte)ctx->flags & 2,unres,(lys_module **)&local_1168);
              if (LVar14 != LY_SUCCESS) goto LAB_00143576;
              if ((lys_module *)local_1168._0_8_ != (lys_module *)0x0) {
                ly_log(ctx,LY_LLWRN,LY_SUCCESS,
                       "Must condition \"%s\" check skipped because referenced module \"%s\" is not implemented."
                       ,plVar23->cond->expr,*(lysc_ext_instance **)(local_1168._0_8_ + 8));
                bVar45 = true;
              }
              plVar34 = (lysc_ext_instance *)((long)&plVar34->def + 1);
              plVar23 = plVar23 + 1;
            }
            if (!bVar45) break;
            lysc_unres_must_free((lysc_unres_must *)plVar5);
            ly_set_rm_index(local_1230,(uint32_t)uVar24,(_func_void_void_ptr *)0x0);
            if ((unres->ds_unres).musts.count <= uVar24) goto LAB_0014353b;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < (unres->ds_unres).musts.count);
      }
LAB_0014353b:
      local_11f8._0_8_ = plVar34;
    } while ((((uint)uVar38 < (unres->ds_unres).disabled_leafrefs.count) ||
             ((uint)uVar35 < (unres->ds_unres).leafrefs.count)) ||
            ((uint)uVar40 < (unres->ds_unres).whens.count));
    LVar14 = LY_SUCCESS;
LAB_00143576:
    local_11f8._0_8_ = plVar34;
    if (LVar14 != LY_SUCCESS) goto LAB_00144a0b;
    while (uVar4 = (unres->ds_unres).disabled_leafrefs.count, uVar4 != 0) {
      uVar33 = uVar4 - 1;
      plVar5 = (unres->ds_unres).disabled_leafrefs.field_2.dnodes[uVar33];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar5->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = (*(lysc_node **)plVar5)->module->parsed->mod->ctx;
      LVar14 = LY_SUCCESS;
      ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      local_1248 = 0;
      plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
      if (plVar16 == (lysc_type_leafref *)0x0) {
        bVar45 = true;
      }
      else {
        do {
          LVar14 = lys_compile_unres_leafref
                             (&local_10d0,*(lysc_node **)plVar5,plVar16,
                              (lysp_module *)plVar5->schema);
          bVar45 = LVar14 == LY_SUCCESS;
          if (!bVar45) goto LAB_001449fb;
          plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
        } while (plVar16 != (lysc_type_leafref *)0x0);
      }
      ly_log_location_revert(1,0,0,0);
      if (!bVar45) goto LAB_00144a0b;
      ly_set_rm_index(local_1200,uVar33,free);
    }
    uVar33 = (uint)local_1240;
    if (uVar33 < (unres->ds_unres).leafrefs.count) {
      uVar35 = local_1240 & 0xffffffff;
      do {
        plVar5 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar35];
        local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
        local_10d0.cur_mod = (local_10d0.pmod)->mod;
        local_10d0.ctx = (local_10d0.cur_mod)->ctx;
        local_10d0.ext = (lysc_ext_instance *)plVar5->parent;
        local_10d0.path_len = 1;
        local_10d0.path[0] = '/';
        local_10d0.free_ctx.ctx = (*(lysc_node **)plVar5)->module->parsed->mod->ctx;
        LVar14 = LY_SUCCESS;
        ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        local_1248 = 0;
        plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
        if (plVar16 == (lysc_type_leafref *)0x0) {
          bVar45 = true;
        }
        else {
          do {
            LVar14 = lys_compile_unres_leafref
                               (&local_10d0,*(lysc_node **)plVar5,plVar16,
                                (lysp_module *)plVar5->schema);
            bVar45 = LVar14 == LY_SUCCESS;
            if (!bVar45) goto LAB_001449fb;
            plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
          } while (plVar16 != (lysc_type_leafref *)0x0);
        }
        ly_log_location_revert(1,0,0,0);
        if (!bVar45) goto LAB_00144a0b;
        uVar35 = uVar35 + 1;
        uVar33 = (uint)local_1240;
      } while (uVar35 < (unres->ds_unres).leafrefs.count);
    }
    uVar35 = local_1240;
    if (uVar33 < (unres->ds_unres).leafrefs.count) {
      uVar35 = (ulong)uVar33;
      do {
        plVar5 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar35];
        local_1248 = 0;
        plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
        while (plVar16 != (lysc_type_leafref *)0x0) {
          pplVar36 = &plVar16->realtype;
          plVar19 = (lysc_type *)pplVar36;
          do {
            plVar6 = *(lyplg_type **)plVar19;
            plVar19 = (lysc_type *)&plVar6->duplicate;
          } while (*(LY_DATA_TYPE *)&plVar6->compare == LY_TYPE_LEAFREF);
          lysc_type_free(local_1220,*pplVar36);
          *pplVar36 = (lysc_type *)plVar6;
          puVar12 = (undefined1 *)((long)&plVar6->compare + 4);
          *(int *)puVar12 = *(int *)puVar12 + 1;
          plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248);
        }
        uVar35 = uVar35 + 1;
      } while (uVar35 < (unres->ds_unres).leafrefs.count);
    }
    while (local_1240 = uVar35, uVar4 = (unres->ds_unres).whens.count, uVar4 != 0) {
      uVar33 = uVar4 - 1;
      plVar5 = (unres->ds_unres).whens.field_2.dnodes[uVar33];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)0x0;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = (*(lysc_node **)plVar5)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar8 = *(lys_module **)plVar5;
      plVar41 = plVar5->schema;
      memset(&local_11f8,0,0x90);
      LVar14 = lyxp_atomize(local_10d0.ctx,*(lyxp_expr **)plVar41,(lys_module *)plVar8->name,
                            LY_VALUE_SCHEMA_RESOLVED,plVar41->parent,(lysc_node *)plVar41->module,
                            (lysc_node *)plVar41->module,&local_11f8,
                            *(uint16_t *)((long)&plVar8->ctx + 2) >> 9 & 0x10 | 8);
      if (LVar14 == LY_SUCCESS) {
        local_10d0.path[0] = '\0';
        lysc_path((lysc_node *)plVar8,LYSC_PATH_LOG,local_10d0.path,0xfee);
        if (local_11f8.used != 0) {
          lVar31 = 0xc;
          uVar35 = 0;
          do {
            if ((*(int *)((long)local_11f8.val.nodes + lVar31 + -4) == 3) &&
               (*(int *)((long)&(local_11f8.val.nodes)->node + lVar31) != -1)) {
              plVar7 = *(lys_module **)((long)local_11f8.val.nodes + lVar31 + -0xc);
              uVar30 = *(ushort *)((long)&plVar41->dsc + 4);
              uVar3 = *(uint16_t *)((long)&plVar7->ctx + 2);
              uVar29 = uVar30 & 0x1c;
              if ((uVar30 & 0x1c) == 0) {
                uVar29 = 4;
              }
              uVar30 = uVar3 & 0x1c;
              if ((uVar3 & 0x1c) == 0) {
                uVar30 = 4;
              }
              if (((lys_module *)plVar8->name == (lys_module *)plVar7->name) && (uVar29 < uVar30)) {
                pcVar39 = "deprecated";
                if (uVar3 == 0x10) {
                  pcVar39 = "obsolete";
                }
                ly_log(local_10d0.ctx,LY_LLWRN,LY_SUCCESS,
                       "When condition \"%s\" may be referencing %s node \"%s\".",
                       *(undefined8 *)(*(long *)plVar41 + 0x28),pcVar39,plVar7->filepath);
              }
              if (plVar7 == (lys_module *)0x0) {
                plVar32 = (lysc_node *)0x0;
              }
              else {
                plVar32 = (lysc_node *)plVar7->revision;
              }
              plVar20 = (lys_module *)lysc_data_node(plVar32);
              if (plVar20 == plVar8) {
                ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,
                        "When condition is accessing its own conditional node children.");
                LVar14 = LY_EVALID;
                goto LAB_00143e1d;
              }
              if ((plVar7 == plVar8) &&
                 (*(int *)((long)&(local_11f8.val.nodes)->node + lVar31) == 1)) {
                ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,
                        "When condition is accessing its own conditional node value.");
                LVar14 = LY_EVALID;
                goto LAB_00143e1d;
              }
            }
            uVar35 = uVar35 + 1;
            lVar31 = lVar31 + 0x18;
          } while (uVar35 < local_11f8.used);
        }
        if (plVar41->module != plVar8) {
          if ((lys_module *)(local_11f8.val.nodes)->node != plVar41->module) {
            __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                          ,0x2a4,
                          "LY_ERR lys_compile_unres_when(struct lysc_ctx *, const struct lysc_when *, const struct lysc_node *)"
                         );
          }
          if ((local_11f8.val.nodes)->pos == 0xffffffff) {
            (local_11f8.val.scnodes)->scnode = (lysc_node *)plVar8;
          }
          else {
            LVar14 = lyxp_set_scnode_insert_node
                               (&local_11f8,(lysc_node *)plVar8,~LYXP_NODE_NONE,LYXP_AXIS_CHILD,
                                (uint32_t *)0x0);
            if (LVar14 != LY_SUCCESS) goto LAB_00143e1d;
          }
        }
        LVar14 = LY_SUCCESS;
        memset(&local_1168,0,0x90);
        if ((ulong)local_11f8.used != 0) {
          lVar31 = 0;
          do {
            if (*(int *)((long)&(local_11f8.val.nodes)->pos + lVar31) != -1) {
              *(undefined4 *)((long)&(local_11f8.val.nodes)->pos + lVar31) = 2;
            }
            lVar31 = lVar31 + 0x18;
          } while ((ulong)local_11f8.used * 0x18 != lVar31);
          uVar35 = 0;
          LVar14 = LY_SUCCESS;
          do {
            if (*(int *)((long)local_11f8.val.nodes + uVar35 * 0x18 + 0xc) == 2) {
              plVar2 = local_11f8.val.scnodes + uVar35 * 0x18;
              puVar37 = (undefined4 *)((long)local_11f8.val.nodes + uVar35 * 0x18 + 0xc);
              if ((plVar2->type == LYXP_NODE_ELEM) &&
                 (pplVar21 = lysc_node_when(plVar2->scnode), pplVar21 != (lysc_when **)0x0)) {
                plVar41 = plVar2->scnode;
                do {
                  ly_log_location(plVar41,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
                  pplVar21 = lysc_node_when(plVar41);
                  plVar42 = (lysc_when *)0x0;
                  while( true ) {
                    if (pplVar21 == (lysc_when **)0x0) {
                      plVar22 = (lysc_when *)0x0;
                    }
                    else {
                      plVar22 = pplVar21[-1];
                    }
                    if (plVar22 <= plVar42) {
                      iVar15 = 0;
                      ly_log_location_revert(1,0,0,0);
                      plVar41 = plVar41->parent;
                      goto LAB_00143d5d;
                    }
                    plVar22 = pplVar21[(long)plVar42];
                    LVar14 = lyxp_atomize(local_11f8.ctx,plVar22->cond,plVar41->module,
                                          LY_VALUE_SCHEMA_RESOLVED,plVar22->prefixes,
                                          plVar22->context,plVar22->context,&local_1168,8);
                    if (LVar14 != LY_SUCCESS) break;
                    if (local_1168.used != 0) {
                      lVar31 = 0;
                      uVar24 = 0;
                      do {
                        if (*(int *)((long)&(local_1168.val.nodes)->type + lVar31) == 3) {
                          lVar13 = lyxp_set_scnode_contains
                                             (&local_11f8,
                                              *(lysc_node **)
                                               ((long)&(local_1168.val.nodes)->node + lVar31),
                                              LYXP_NODE_ELEM,-1,&local_1234);
                          if ((lVar13 != '\0') &&
                             (*(int *)((long)local_11f8.val.nodes + (ulong)local_1234 * 0x18 + 0xc)
                              == -1)) {
                            ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,
                                    "When condition cyclic dependency on the node \"%s\".",
                                    *(undefined8 *)
                                     (*(long *)((long)&(local_1168.val.nodes)->node + lVar31) + 0x28
                                     ));
                            ly_log_location_revert(1,0,0,0);
                            iVar15 = 0xd;
                            LVar14 = LY_EVALID;
                            goto LAB_00143d5d;
                          }
                          *(undefined4 *)((long)&(local_1168.val.nodes)->pos + lVar31) = 2;
                        }
                        else {
                          *(undefined4 *)((long)&(local_1168.val.nodes)->pos + lVar31) = 0;
                        }
                        uVar24 = uVar24 + 1;
                        lVar31 = lVar31 + 0x18;
                      } while (uVar24 < local_1168.used);
                    }
                    if (plVar22->context != plVar41) {
                      if ((lysc_node *)(local_1168.val.nodes)->node != plVar22->context) {
                        __assert_fail("tmp_set.val.scnodes[0].scnode == when->context",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                                      ,0x236,
                                      "LY_ERR lys_compile_unres_when_cyclic(struct lyxp_set *, const struct lysc_node *)"
                                     );
                      }
                      if ((local_1168.val.nodes)->pos == 0xffffffff) {
                        (local_1168.val.scnodes)->scnode = plVar41;
                      }
                      else {
                        LVar14 = lyxp_set_scnode_insert_node
                                           (&local_1168,plVar41,~LYXP_NODE_NONE,LYXP_AXIS_CHILD,
                                            (uint32_t *)0x0);
                        if (LVar14 != LY_SUCCESS) goto LAB_00143d48;
                      }
                    }
                    lyxp_set_scnode_merge(&local_11f8,&local_1168);
                    plVar42 = (lysc_when *)((long)&plVar42->cond + 1);
                    LVar14 = LY_SUCCESS;
                  }
                  ly_vlog(local_11f8.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid when condition \"%s\"."
                          ,plVar22->cond->expr);
LAB_00143d48:
                  ly_log_location_revert(1,0,0,0);
                  iVar15 = 0xd;
LAB_00143d5d:
                  if (iVar15 != 0) {
                    if (iVar15 == 0xd) goto LAB_00143dba;
                    goto LAB_00143e1d;
                  }
                } while ((plVar41 != (lysc_node *)0x0) && ((plVar41->nodetype & 0x82) != 0));
                puVar37 = (undefined4 *)((long)local_11f8.val.nodes + uVar35 * 0x18 + 0xc);
              }
              *puVar37 = 0;
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 < local_11f8.used);
        }
LAB_00143dba:
        lyxp_set_free_content(&local_1168);
      }
      else {
        ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid when condition \"%s\".",
                *(undefined8 *)(*(long *)plVar41 + 0x28));
      }
LAB_00143e1d:
      lyxp_set_free_content(&local_11f8);
      ly_log_location_revert(1,0,0,0);
      if (LVar14 != LY_SUCCESS) goto LAB_00144a0b;
      free(plVar5);
      ly_set_rm_index(local_1228,uVar33,(_func_void_void_ptr *)0x0);
      uVar35 = local_1240;
    }
    while (uVar4 = (unres->ds_unres).musts.count, uVar4 != 0) {
      uVar33 = uVar4 - 1;
      plVar5 = (unres->ds_unres).musts.field_2.dnodes[uVar33];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar5->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = (*(lysc_node **)plVar5)->module->parsed->mod->ctx;
      ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar41 = *(lysc_node **)plVar5;
      plVar32 = plVar5->schema;
      ly_log_location(plVar41,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      memset(&local_1168,0,0x90);
      local_1270 = plVar41->flags >> 9 & 0x10 | 8;
      plVar23 = lysc_node_musts(plVar41);
      plVar34 = (lysc_ext_instance *)0x0;
      while( true ) {
        if (plVar23 == (lysc_must *)0x0) {
          plVar18 = (lysc_ext_instance *)0x0;
        }
        else {
          plVar18 = plVar23[-1].exts;
        }
        if (plVar18 <= plVar34) {
          LVar14 = LY_SUCCESS;
          goto LAB_001440b8;
        }
        LVar14 = lyxp_atomize(local_10d0.ctx,plVar23[(long)plVar34].cond,plVar41->module,
                              LY_VALUE_SCHEMA_RESOLVED,plVar23[(long)plVar34].prefixes,plVar41,
                              plVar41,&local_1168,local_1270);
        if (LVar14 != LY_SUCCESS) break;
        local_10d0.path[0] = '\0';
        lysc_path(plVar41,LYSC_PATH_LOG,local_10d0.path,0xfee);
        if ((ulong)local_1168.used != 0) {
          lVar31 = 0;
          do {
            if (*(int *)((long)&(local_1168.val.nodes)->type + lVar31) == 3) {
              plVar8 = (lys_module *)**(undefined8 **)(plVar32->hash + (long)plVar34 * 8 + -4);
              uVar30 = 4;
              if (plVar8 == plVar41->module) {
                uVar30 = plVar41->flags & 0x1c;
              }
              lVar9 = *(long *)((long)&(local_1168.val.nodes)->node + lVar31);
              uVar3 = *(ushort *)(lVar9 + 2);
              if (uVar30 == 0) {
                uVar30 = 4;
              }
              uVar29 = uVar3 & 0x1c;
              if ((uVar3 & 0x1c) == 0) {
                uVar29 = 4;
              }
              if ((plVar8 == *(lys_module **)(lVar9 + 8)) && (uVar30 < uVar29)) {
                pcVar39 = "deprecated";
                if (uVar3 == 0x10) {
                  pcVar39 = "obsolete";
                }
                ly_log(local_10d0.ctx,LY_LLWRN,LY_SUCCESS,
                       "Must condition \"%s\" may be referencing %s node \"%s\".",
                       (plVar23[(long)plVar34].cond)->expr,pcVar39,*(undefined8 *)(lVar9 + 0x28));
                break;
              }
            }
            lVar31 = lVar31 + 0x18;
          } while ((ulong)local_1168.used * 0x18 != lVar31);
        }
        lyxp_set_free_content(&local_1168);
        plVar34 = (lysc_ext_instance *)((long)&plVar34->def + 1);
      }
      ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid must condition \"%s\".",
              (plVar23[(long)plVar34].cond)->expr);
LAB_001440b8:
      lyxp_set_free_content(&local_1168);
      ly_log_location_revert(1,0,0,0);
      ly_log_location_revert(1,0,0,0);
      if (LVar14 != LY_SUCCESS) goto LAB_00144a0b;
      lysc_unres_must_free((lysc_unres_must *)plVar5);
      ly_set_rm_index(local_1230,uVar33,(_func_void_void_ptr *)0x0);
    }
    while (uVar4 = (unres->ds_unres).disabled_bitenums.count, uVar4 != 0) {
      uVar33 = uVar4 - 1;
      plVar41 = (lysc_node *)(unres->ds_unres).disabled_bitenums.field_2.dnodes[uVar33];
      local_10d0.pmod = plVar41->module->parsed;
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)0x0;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = plVar41->module->parsed->mod->ctx;
      ly_log_location(plVar41,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      if (*(int *)&(plVar41[1].parent)->next == 0xf) {
        plVar32 = (plVar41[1].parent)->prev;
        if (plVar32 == (lysc_node *)0x0) {
          pvVar44 = (void *)0x0;
        }
        else {
          pvVar44 = plVar32[-1].priv;
        }
      }
      else {
        plVar32 = (lysc_node *)&plVar41[1].parent;
        pvVar44 = (void *)0x1;
      }
      if (pvVar44 == (void *)0x0) {
LAB_001442c8:
        bVar45 = false;
        ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_SEMANTICS,
                "Node \"%s\" without any (or all disabled) valid values.",plVar41->name);
        LVar14 = LY_EVALID;
      }
      else {
        pvVar28 = (void *)0x0;
        local_1218 = plVar41;
        bVar45 = false;
        do {
          lVar31 = *(long *)(plVar32->hash + (long)pvVar28 * 8 + -4);
          if ((*(int *)(lVar31 + 0x18) == 0xb) || (bVar11 = true, *(int *)(lVar31 + 0x18) == 7)) {
            lVar9 = *(long *)(lVar31 + 0x20);
            uVar35 = 0;
            do {
              item = (lysc_type_bitenum_item *)(lVar9 + uVar35 * 0x28);
              while( true ) {
                if (lVar9 == 0) {
                  uVar24 = 0;
                }
                else {
                  uVar24 = *(ulong *)(lVar9 + -8);
                }
                if (uVar24 <= uVar35) {
                  bVar11 = bVar45;
                  if ((*(long *)(lVar31 + 0x20) != 0) &&
                     (*(long *)(*(long *)(lVar31 + 0x20) + -8) != 0)) {
                    bVar11 = true;
                  }
                  goto LAB_001442a4;
                }
                if ((item->flags & 0x100) == 0) break;
                lysc_enum_item_free(local_1220,item);
                if (lVar9 == 0) {
                  uVar24 = 0xffffffffffffffff;
                }
                else {
                  uVar24 = *(long *)(lVar9 + -8) - 1;
                }
                if (uVar35 <= uVar24 && uVar24 - uVar35 != 0) {
                  memmove(item,(void *)(lVar9 + uVar35 * 0x28 + 0x28),(uVar24 - uVar35) * 0x28);
                }
                *(long *)(lVar9 + -8) = *(long *)(lVar9 + -8) + -1;
              }
              uVar35 = uVar35 + 1;
            } while( true );
          }
LAB_001442a4:
          pvVar28 = (void *)((long)pvVar28 + 1);
          bVar45 = bVar11;
        } while (pvVar28 != pvVar44);
        plVar41 = local_1218;
        if (!bVar11) goto LAB_001442c8;
        LVar14 = LY_SUCCESS;
        bVar45 = true;
      }
      ly_log_location_revert(1,0,0,0);
      if (!bVar45) goto LAB_00144a0b;
      ly_set_rm_index(local_1208,uVar33,(_func_void_void_ptr *)0x0);
    }
    uVar4 = (unres->ds_unres).dflts.count;
    while (uVar4 != 0) {
      plVar5 = (unres->ds_unres).dflts.field_2.dnodes[uVar4 - 1];
      local_10d0.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.cur_mod = (lys_module *)**(long **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.ext = (lysc_ext_instance *)0x0;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar5 + 8) + 0x50)
      ;
      ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      plVar41 = *(lysc_node **)plVar5;
      plVar32 = plVar5->schema;
      if (plVar41->nodetype == 4) {
        if (plVar41[1].prev != (lysc_node *)0x0) {
          __assert_fail("!leaf->dflt",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x3de,
                        "LY_ERR lys_compile_unres_leaf_dlft(struct lysc_ctx *, struct lysc_node_leaf *, struct lysp_qname *, struct lys_glob_unres *)"
                       );
        }
        LVar14 = LY_SUCCESS;
        if ((plVar41->flags & 0x120) == 0) {
          plVar25 = (lysc_node *)calloc(1,0x28);
          plVar41[1].prev = plVar25;
          if (plVar25 == (lysc_node *)0x0) {
            LVar14 = LY_EMEM;
            ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
          }
          else {
            LVar14 = lys_compile_unres_dflt
                               (&local_10d0,plVar41,(lysc_type *)plVar41[1].parent,*(char **)plVar32
                                ,(lysp_module *)plVar32->module,(lyd_value *)plVar25,unres);
            if (LVar14 != LY_SUCCESS) {
              free(plVar41[1].prev);
              plVar41[1].prev = (lysc_node *)0x0;
            }
          }
        }
      }
      else {
        plVar10 = plVar5->parent;
        if (plVar32 == (lysc_node *)0x0 && plVar10 == (lyd_node_inner *)0x0) {
          __assert_fail("dflt || dflts",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x404,
                        "LY_ERR lys_compile_unres_llist_dflts(struct lysc_ctx *, struct lysc_node_leaflist *, struct lysp_qname *, struct lysp_qname *, struct lys_glob_unres *)"
                       );
        }
        plVar25 = plVar41[1].prev;
        if (plVar25 == (lysc_node *)0x0) {
          pvVar44 = (void *)0x0;
          if (plVar10 == (lyd_node_inner *)0x0) {
            plVar26 = (ly_ht *)0x1;
          }
          else {
            plVar26 = plVar10[-1].children_ht;
          }
          plVar27 = (long *)calloc(1,(long)plVar26 * 8 + 8);
        }
        else {
          pvVar44 = plVar25[-1].priv;
          if (plVar10 == (lyd_node_inner *)0x0) {
            plVar26 = (ly_ht *)0x1;
          }
          else {
            plVar26 = plVar10[-1].children_ht;
          }
          plVar27 = (long *)realloc(&plVar25[-1].priv,
                                    ((long)&plVar26->used + (long)plVar25[-1].priv + (long)pvVar44)
                                    * 8 + 8);
        }
        if (plVar27 == (long *)0x0) {
          LVar14 = LY_EMEM;
          ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_unres_llist_dflts");
        }
        else {
          plVar41[1].prev = (lysc_node *)(plVar27 + 1);
          if (plVar10 == (lyd_node_inner *)0x0) {
            memset(plVar27 + *plVar27 + 1,0,(long)pvVar44 * 8 + 8);
            storage = (lyd_value *)calloc(1,0x28);
            *(lyd_value **)(((lysc_node *)(plVar27 + 1))->hash + (long)pvVar44 * 8 + -4) = storage;
            LVar14 = lys_compile_unres_dflt
                               (&local_10d0,plVar41,(lysc_type *)plVar41[1].parent,*(char **)plVar32
                                ,(lysp_module *)plVar32->module,storage,unres);
            if (LVar14 != LY_SUCCESS) {
              free(*(void **)((plVar41[1].prev)->hash + (long)pvVar44 * 8 + -4));
              goto LAB_0014477b;
            }
            ppvVar1 = &plVar41[1].prev[-1].priv;
            *ppvVar1 = (void *)((long)*ppvVar1 + 1);
          }
          else {
            plVar26 = plVar10[-1].children_ht;
            memset(plVar27 + *plVar27 + 1,0,((long)&plVar26->used + (long)pvVar44) * 8);
            if (plVar26 != (ly_ht *)0x0) {
              pplVar43 = (lysp_module **)&(plVar10->field_0).node.schema;
              plVar26 = (ly_ht *)0x0;
              do {
                pvVar28 = calloc(1,0x28);
                *(void **)((plVar41[1].prev)->hash + (long)plVar26 * 8 + (long)pvVar44 * 8 + -4) =
                     pvVar28;
                LVar14 = lys_compile_unres_dflt
                                   (&local_10d0,plVar41,(lysc_type *)plVar41[1].parent,
                                    ((lysp_qname *)(pplVar43 + -1))->str,*pplVar43,
                                    *(lyd_value **)
                                     ((plVar41[1].prev)->hash +
                                     (long)plVar26 * 8 + (long)pvVar44 * 8 + -4),unres);
                if (LVar14 != LY_SUCCESS) {
                  free(*(void **)((plVar41[1].prev)->hash +
                                 (long)plVar26 * 8 + (long)pvVar44 * 8 + -4));
                  goto LAB_0014477b;
                }
                ppvVar1 = &plVar41[1].prev[-1].priv;
                *ppvVar1 = (void *)((long)*ppvVar1 + 1);
                plVar26 = (ly_ht *)((long)&plVar26->used + 1);
                pplVar43 = pplVar43 + 3;
              } while (plVar26 < plVar10[-1].children_ht);
            }
          }
          LVar14 = LY_SUCCESS;
          if ((plVar41->flags & 1) != 0) {
            while( true ) {
              if (plVar41[1].prev == (lysc_node *)0x0) {
                pvVar28 = (void *)0x0;
              }
              else {
                pvVar28 = plVar41[1].prev[-1].priv;
              }
              if (pvVar28 <= pvVar44) break;
              if (pvVar44 != (void *)0x0) {
                pvVar28 = (void *)0x0;
                do {
                  lVar31 = *(long *)((plVar41[1].prev)->hash + (long)pvVar44 * 8 + -4);
                  iVar15 = (**(code **)(*(long *)(*(long *)(lVar31 + 8) + 0x10) + 0x18))
                                     (local_10d0.ctx,lVar31,
                                      *(undefined8 *)
                                       ((plVar41[1].prev)->hash + (long)pvVar28 * 8 + -4));
                  ctx_00 = local_10d0.ctx;
                  if (iVar15 == 0) {
                    lVar31 = *(long *)((plVar41[1].prev)->hash + (long)pvVar44 * 8 + -4);
                    (**(code **)(*(long *)(*(long *)(lVar31 + 8) + 0x10) + 0x28))
                              (local_10d0.ctx,lVar31,0,0,0,0);
                    ly_vlog(ctx_00,(char *)0x0,LYVE_SEMANTICS,
                            "Configuration leaf-list has multiple defaults of the same value \"%s\"."
                           );
                    LVar14 = LY_EVALID;
                    goto LAB_0014477b;
                  }
                  pvVar28 = (void *)((long)pvVar28 + 1);
                } while (pvVar44 != pvVar28);
              }
              pvVar44 = (void *)((long)pvVar44 + 1);
            }
          }
        }
      }
LAB_0014477b:
      ly_log_location_revert(1,0,0,0);
      if (LVar14 != LY_SUCCESS) goto LAB_00144a0b;
      lysc_unres_dflt_free(ctx,(lysc_unres_dflt *)plVar5);
      ly_set_rm_index(local_1210,uVar4 - 1,(_func_void_void_ptr *)0x0);
      uVar4 = (unres->ds_unres).dflts.count;
    }
  } while (((((uint32_t)local_1240 != (unres->ds_unres).leafrefs.count) ||
            ((unres->ds_unres).disabled_leafrefs.count != 0)) ||
           ((unres->ds_unres).whens.count != 0)) || ((unres->ds_unres).musts.count != 0));
  if ((unres->ds_unres).disabled.count != 0) {
    uVar35 = 0;
    do {
      plVar41 = (lysc_node *)(unres->ds_unres).disabled.field_2.dnodes[uVar35];
      LVar14 = lys_compile_unres_check_disabled(plVar41);
      if (LVar14 != LY_SUCCESS) goto LAB_00144a0b;
      local_10d0.pmod = plVar41->module->parsed;
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)0x0;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = plVar41->module->parsed->mod->ctx;
      lysc_node_free(&local_10d0.free_ctx,plVar41,'\x01');
      uVar35 = uVar35 + 1;
    } while (uVar35 < (unres->ds_unres).disabled.count);
  }
  if ((unres->ds_unres).leafrefs.count == 0) {
    LVar14 = LY_SUCCESS;
  }
  else {
    uVar35 = 0;
    do {
      plVar5 = (unres->ds_unres).leafrefs.field_2.dnodes[uVar35];
      local_10d0.pmod = *(lysp_module **)(*(long *)(*(long *)plVar5 + 8) + 0x50);
      local_10d0.cur_mod = (local_10d0.pmod)->mod;
      local_10d0.ctx = (local_10d0.cur_mod)->ctx;
      local_10d0.ext = (lysc_ext_instance *)plVar5->parent;
      local_10d0.path_len = 1;
      local_10d0.path[0] = '/';
      local_10d0.free_ctx.ctx = *(ly_ctx **)**(undefined8 **)(*(long *)(*(long *)plVar5 + 8) + 0x50)
      ;
      local_1248 = 0;
      while (plVar16 = lys_type_leafref_next(*(lysc_node **)plVar5,&local_1248),
            plVar16 != (lysc_type_leafref *)0x0) {
        LVar14 = ly_path_compile_leafref
                           (local_10d0.ctx,*(lysc_node **)plVar5,local_10d0.ext,plVar16->path,
                            (((*(lysc_node **)plVar5)->flags >> 0xd & 1) != 0) + 1,0x20,
                            LY_VALUE_SCHEMA_RESOLVED,plVar16->prefixes,(ly_path **)&local_1168);
        ly_path_free((ly_path *)local_1168._0_8_);
        if (LVar14 != LY_SUCCESS) {
          if (LVar14 == LY_ERECOMPILE) {
            __assert_fail("ret != LY_ERECOMPILE",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                          ,0x5b9,
                          "LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)"
                         );
          }
          ly_log_location(*(lysc_node **)plVar5,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                  "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                  *(undefined8 *)(*(long *)plVar5 + 0x28));
          LVar14 = LY_EVALID;
LAB_001449fb:
          ly_log_location_revert(1,0,0,0);
          goto LAB_00144a0b;
        }
      }
      uVar35 = uVar35 + 1;
      LVar14 = LY_SUCCESS;
    } while (uVar35 < (unres->ds_unres).leafrefs.count);
  }
LAB_00144a0b:
  if (local_10d0.free_ctx.ext_set.count == 0) {
    return LVar14;
  }
  __assert_fail("!cctx.free_ctx.ext_set.count",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                ,0x5c6,"LY_ERR lys_compile_unres_depset(struct ly_ctx *, struct lys_glob_unres *)");
}

Assistant:

static LY_ERR
lys_compile_unres_depset(struct ly_ctx *ctx, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_node *node;
    struct lysc_type *typeiter;
    struct lysc_type_leafref *lref;
    struct lysc_ctx cctx = {0};
    struct lys_depset_unres *ds_unres = &unres->ds_unres;
    struct ly_path *path;
    LY_ARRAY_COUNT_TYPE v;
    struct lysc_unres_leafref *l;
    struct lysc_unres_when *w;
    struct lysc_unres_must *m;
    struct lysc_unres_dflt *d;
    uint32_t i, processed_leafrefs = 0;

resolve_all:
    /* implement all referenced modules to get final ds_unres set */
    if ((ret = lys_compile_unres_depset_implement(ctx, unres))) {
        goto cleanup;
    }

    /* check disabled leafrefs */
    while (ds_unres->disabled_leafrefs.count) {
        /* remember index, it can change before we get to free this item */
        i = ds_unres->disabled_leafrefs.count - 1;
        l = ds_unres->disabled_leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_leafrefs, i, free);
    }

    /* for leafref, we need 2 rounds - first detects circular chain by storing the first referred type (which
     * can be also leafref, in case it is already resolved, go through the chain and check that it does not
     * point to the starting leafref type). The second round stores the first non-leafref type for later data validation.
     * Also do the same check for set of the disabled leafrefs, but without the second round. */
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        LOG_LOCSET(l->node, NULL);
        v = 0;
        while ((ret == LY_SUCCESS) && (lref = lys_type_leafref_next(l->node, &v))) {
            ret = lys_compile_unres_leafref(&cctx, l->node, lref, l->local_mod);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);
    }
    for (i = processed_leafrefs; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];

        /* store pointer to the real type */
        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            for (typeiter = lref->realtype;
                    typeiter->basetype == LY_TYPE_LEAFREF;
                    typeiter = ((struct lysc_type_leafref *)typeiter)->realtype) {}

            lysc_type_free(&cctx.free_ctx, lref->realtype);
            lref->realtype = typeiter;
            ++lref->realtype->refcount;
        }

        /* if 'goto' will be used on the 'resolve_all' label, then the current leafref will not be processed again */
        processed_leafrefs++;
    }

    /* check when, the referenced modules must be implemented now */
    while (ds_unres->whens.count) {
        i = ds_unres->whens.count - 1;
        w = ds_unres->whens.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, w->node->module->parsed, NULL);

        LOG_LOCSET(w->node, NULL);
        ret = lys_compile_unres_when(&cctx, w->when, w->node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        free(w);
        ly_set_rm_index(&ds_unres->whens, i, NULL);
    }

    /* check must */
    while (ds_unres->musts.count) {
        i = ds_unres->musts.count - 1;
        m = ds_unres->musts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, m->node->module->parsed, m->ext);

        LOG_LOCSET(m->node, NULL);
        ret = lys_compile_unres_must(&cctx, m->node, m->local_mods);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_must_free(m);
        ly_set_rm_index(&ds_unres->musts, i, NULL);
    }

    /* remove disabled enums/bits */
    while (ds_unres->disabled_bitenums.count) {
        i = ds_unres->disabled_bitenums.count - 1;
        node = ds_unres->disabled_bitenums.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        LOG_LOCSET(node, NULL);
        ret = lys_compile_unres_disabled_bitenum(&cctx, (struct lysc_node_leaf *)node);
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        ly_set_rm_index(&ds_unres->disabled_bitenums, i, NULL);
    }

    /* finish incomplete default values compilation */
    while (ds_unres->dflts.count) {
        i = ds_unres->dflts.count - 1;
        d = ds_unres->dflts.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, d->leaf->module->parsed, NULL);

        LOG_LOCSET(&d->leaf->node, NULL);
        if (d->leaf->nodetype == LYS_LEAF) {
            ret = lys_compile_unres_leaf_dlft(&cctx, d->leaf, d->dflt, unres);
        } else {
            ret = lys_compile_unres_llist_dflts(&cctx, d->llist, d->dflt, d->dflts, unres);
        }
        LOG_LOCBACK(1, 0);
        LY_CHECK_GOTO(ret, cleanup);

        lysc_unres_dflt_free(ctx, d);
        ly_set_rm_index(&ds_unres->dflts, i, NULL);
    }

    /* some unres items may have been added by the default values */
    if ((processed_leafrefs != ds_unres->leafrefs.count) || ds_unres->disabled_leafrefs.count ||
            ds_unres->whens.count || ds_unres->musts.count || ds_unres->dflts.count) {
        goto resolve_all;
    }

    /* finally, remove all disabled nodes */
    for (i = 0; i < ds_unres->disabled.count; ++i) {
        node = ds_unres->disabled.snodes[i];
        ret = lys_compile_unres_check_disabled(node);
        LY_CHECK_GOTO(ret, cleanup);

        LYSC_CTX_INIT_PMOD(cctx, node->module->parsed, NULL);

        lysc_node_free(&cctx.free_ctx, node, 1);
    }

    /* also check if the leafref target has not been disabled */
    for (i = 0; i < ds_unres->leafrefs.count; ++i) {
        l = ds_unres->leafrefs.objs[i];
        LYSC_CTX_INIT_PMOD(cctx, l->node->module->parsed, l->ext);

        v = 0;
        while ((lref = lys_type_leafref_next(l->node, &v))) {
            ret = ly_path_compile_leafref(cctx.ctx, l->node, cctx.ext, lref->path,
                    (l->node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &path);
            ly_path_free(path);

            assert(ret != LY_ERECOMPILE);
            if (ret) {
                LOG_LOCSET(l->node, NULL);
                LOGVAL(ctx, LYVE_REFERENCE, "Target of leafref \"%s\" cannot be referenced because it is disabled.",
                        l->node->name);
                LOG_LOCBACK(1, 0);
                ret = LY_EVALID;
                goto cleanup;
            }
        }
    }

cleanup:
    assert(!cctx.free_ctx.ext_set.count);
    return ret;
}